

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O2

void __thiscall LSL_RLE<TTA>::FirstScan(LSL_RLE<TTA> *this)

{
  uint uVar1;
  uint uVar2;
  Mat1b *pMVar3;
  uint *puVar4;
  uint **ppuVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  int er_1;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int er;
  uint uVar18;
  long lVar19;
  bool bVar20;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar1 = *(uint *)&pMVar3->field_0x8;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  uVar11 = 0;
  uVar13 = 0;
  if (0 < (int)uVar2) {
    uVar13 = (ulong)uVar2;
  }
  uVar14 = 0;
  if (0 < (int)uVar1) {
    uVar14 = (ulong)uVar1;
  }
  for (; uVar11 != uVar14; uVar11 = uVar11 + 1) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    puVar4 = (this->ER).prows[uVar11];
    ppuVar5 = (this->RLC).prows;
    puVar6 = ppuVar5[uVar11];
    lVar19 = **(long **)&pMVar3->field_0x48;
    lVar15 = *(long *)&pMVar3->field_0x10;
    uVar18 = 0;
    uVar17 = 0;
    uVar9 = 0;
    for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
      bVar20 = *(char *)(lVar19 * uVar11 + lVar15 + uVar16) != '\0';
      if (uVar9 != bVar20) {
        puVar6[(int)uVar18] = (int)uVar16 - uVar17;
        uVar17 = uVar17 ^ 1;
        uVar18 = uVar18 + 1;
      }
      puVar4[uVar16] = uVar18;
      uVar9 = (uint)bVar20;
    }
    puVar6[(int)uVar18] = uVar2 - uVar17;
    this->ner[uVar11] = uVar9 + uVar18;
    ppuVar5[uVar11 + 1] = puVar6 + (long)(int)(uVar9 + uVar18) + 1;
  }
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  memset(*(this->ERA).prows,0,(long)(int)((uVar2 + 1) * uVar1) << 2);
  puVar4 = *(this->ERA).prows;
  for (lVar19 = 1; piVar12 = this->ner, lVar19 <= *piVar12; lVar19 = lVar19 + 2) {
    uVar9 = TTA::NewLabel();
    puVar4[lVar19] = uVar9;
  }
  for (lVar19 = 1; lVar19 < (int)uVar1; lVar19 = lVar19 + 1) {
    ppuVar5 = (this->ERA).prows;
    puVar4 = ppuVar5[lVar19 + -1];
    puVar6 = ppuVar5[lVar19];
    puVar7 = (this->ER).prows[lVar19 + -1];
    puVar8 = (this->RLC).prows[lVar19];
    for (lVar15 = 1; lVar15 <= piVar12[lVar19]; lVar15 = lVar15 + 2) {
      uVar9 = puVar8[lVar15 + -1];
      uVar18 = puVar8[lVar15];
      uVar18 = puVar7[(int)(((int)uVar18 < (int)(uVar2 - 1)) + uVar18)];
      uVar11 = (long)(int)puVar7[(int)(uVar9 - (0 < (int)uVar9))] | 1;
      iVar10 = uVar18 + (uVar18 & 1) + -1;
      if (iVar10 < (int)uVar11) {
        uVar9 = TTA::NewLabel();
      }
      else {
        uVar9 = TTA::rtable_[puVar4[uVar11]];
        while (uVar13 = uVar11 + 2, (long)uVar13 <= (long)iVar10) {
          uVar18 = TTA::rtable_[puVar4[uVar11 + 2]];
          if ((int)uVar9 < (int)uVar18) {
            TTA::UpdateTable(uVar18,uVar9);
          }
          uVar11 = uVar13;
          if ((int)uVar18 < (int)uVar9) {
            TTA::UpdateTable(uVar9,uVar18);
            uVar9 = uVar18;
          }
        }
      }
      puVar6[lVar15] = uVar9;
      piVar12 = this->ner;
    }
  }
  return;
}

Assistant:

void FirstScan()
    {
        int rows = img_.rows;
        int cols = img_.cols;

        // Step 1
        for (int r = 0; r < rows; ++r) {
            // Get pointers to rows
            const unsigned char* img_r = img_.ptr<unsigned char>(r);
            unsigned* ER_r = ER.prows[r];
            unsigned* RLC_r = RLC.prows[r];
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c) {
                x0 = img_r[c] > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC_r[er] = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER_r[c] = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC_r[er] = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
            // Compact RLC usage
            RLC.prows[r + 1] = RLC_r + er + 1;
        }